

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::addColsInterface
          (Highs *this,HighsInt ext_num_new_col,double *ext_col_cost,double *ext_col_lower,
          double *ext_col_upper,HighsInt ext_num_new_nz,HighsInt *ext_a_start,HighsInt *ext_a_index,
          double *ext_a_value)

{
  HighsLogOptions *pHVar1;
  vector<double,_std::allocator<double>_> *this_00;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar2;
  HighsInt HVar3;
  int iVar4;
  pointer pdVar5;
  undefined1 auVar6 [16];
  Highs *pHVar7;
  pointer piVar8;
  bool bVar9;
  HighsStatus HVar10;
  HighsStatus call_status;
  HighsStatus HVar11;
  ulong uVar12;
  char *format;
  int ext_num_new_col_00;
  undefined4 in_register_00000034;
  size_type __new_size;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  vector<double,_std::allocator<double>_> local_colUpper;
  vector<double,_std::allocator<double>_> local_colLower;
  vector<double,_std::allocator<double>_> local_colCost;
  allocator_type local_382;
  bool local_381;
  Highs *local_380;
  HighsOptions *local_378;
  ulong local_370;
  string local_368;
  ulong local_340;
  HighsInt *local_338;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *local_330;
  HighsLogOptions *local_328;
  undefined1 local_320 [16];
  vector<int,_std::allocator<int>_> local_310 [2];
  pointer local_2e0;
  pointer piStack_2d8;
  pointer local_2d0;
  pointer local_2c8;
  pointer pdStack_2c0;
  pointer local_2b8;
  vector<double,_std::allocator<double>_> local_2b0;
  vector<double,_std::allocator<double>_> local_298;
  vector<double,_std::allocator<double>_> local_280;
  void **local_268;
  long local_260;
  string local_258;
  HighsIndexCollection local_238;
  string local_1e8;
  HighsLogOptions local_1c8;
  HighsLogOptions local_168;
  HighsLogOptions local_108;
  HighsSparseMatrix local_a0;
  long lVar17;
  
  local_370 = CONCAT44(in_register_00000034,ext_num_new_col);
  if ((ext_num_new_nz | ext_num_new_col) < 0) {
    return kError;
  }
  if (ext_num_new_col == 0) {
    return kOk;
  }
  pHVar1 = &(this->options_).super_HighsOptionsStruct.log_options;
  local_380 = this;
  bVar9 = isColDataNull(pHVar1,ext_col_cost,ext_col_lower,ext_col_upper);
  if (bVar9) {
    return kError;
  }
  if (ext_num_new_nz != 0) {
    bVar9 = isMatrixDataNull(pHVar1,ext_a_start,ext_a_index,ext_a_value);
    if (bVar9) {
      return kError;
    }
    if ((local_380->model_).lp_.num_row_ < 1) {
      return kError;
    }
  }
  pHVar7 = local_380;
  local_338 = &(local_380->model_).lp_.num_row_;
  local_260 = (long)(local_380->model_).lp_.num_col_;
  local_238.is_set_ = false;
  local_238.set_num_entries_ = -1;
  local_238.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_238.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_238.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_238.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_238.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_238.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_238.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_238._41_8_ = 0;
  local_238.dimension_ = (HighsInt)local_370;
  local_238.is_interval_ = true;
  local_238.from_ = 0;
  local_238.to_ = local_238.dimension_ + -1;
  uVar12 = local_370 & 0xffffffff;
  local_328 = pHVar1;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_280,ext_col_cost,ext_col_cost + uVar12,
             (allocator_type *)local_320);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_298,ext_col_lower,
             ext_col_lower + uVar12,(allocator_type *)local_320);
  local_340 = uVar12;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_2b0,ext_col_upper,
             ext_col_upper + uVar12,(allocator_type *)local_320);
  pHVar1 = local_328;
  local_381 = false;
  local_108.log_stream = local_328->log_stream;
  local_108.output_flag = local_328->output_flag;
  local_108.log_to_console = local_328->log_to_console;
  local_108.log_dev_level = local_328->log_dev_level;
  local_108.user_log_callback = local_328->user_log_callback;
  local_108.user_log_callback_data = local_328->user_log_callback_data;
  pfVar2 = &local_108.user_callback;
  local_330 = &(pHVar7->options_).super_HighsOptionsStruct.log_options.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar2,local_330);
  local_378 = &pHVar7->options_;
  local_108.user_callback_active =
       (pHVar7->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_108.user_callback_data =
       (pHVar7->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  HVar10 = assessCosts(local_378,(pHVar7->model_).lp_.num_col_,&local_238,&local_280,&local_381,
                       (pHVar7->options_).super_HighsOptionsStruct.infinite_cost);
  local_320._0_8_ = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"assessCosts","");
  HVar10 = interpretCallStatus(&local_108,HVar10,kOk,(string *)local_320);
  if ((vector<int,_std::allocator<int>_> *)local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_);
  }
  if (local_108.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  HVar11 = kError;
  if (HVar10 == kError) goto LAB_0022cae8;
  local_168.log_stream = pHVar1->log_stream;
  local_168.output_flag = pHVar1->output_flag;
  local_168.log_to_console = pHVar1->log_to_console;
  local_168.log_dev_level = pHVar1->log_dev_level;
  local_168.user_log_callback = pHVar1->user_log_callback;
  local_168.user_log_callback_data = pHVar1->user_log_callback_data;
  pfVar2 = &local_168.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar2,local_330);
  local_268 = &(local_380->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  local_168.user_callback_active =
       (local_380->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_168.user_callback_data = *local_268;
  call_status = assessBounds(local_378,"Col",(local_380->model_).lp_.num_col_,&local_238,&local_298,
                             &local_2b0,
                             (local_380->options_).super_HighsOptionsStruct.infinite_bound,
                             (HighsVarType *)0x0);
  local_320._0_8_ = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"assessBounds","");
  HVar10 = interpretCallStatus(&local_168,call_status,HVar10,(string *)local_320);
  if ((vector<int,_std::allocator<int>_> *)local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_);
  }
  if (local_168.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_168.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  if (HVar10 == kError) goto LAB_0022cae8;
  HVar3 = (local_380->model_).lp_.user_bound_scale_;
  if (HVar3 != 0) {
    bVar9 = boundScaleOk(&local_298,&local_2b0,HVar3,
                         (local_380->options_).super_HighsOptionsStruct.infinite_bound);
    if (bVar9) {
      dVar14 = ldexp(1.0,(local_380->model_).lp_.user_bound_scale_);
      if (0 < (int)local_370) {
        uVar12 = 0;
        do {
          local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] =
               local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12] * dVar14;
          local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] =
               local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12] * dVar14;
          uVar12 = uVar12 + 1;
        } while (local_340 != uVar12);
      }
      goto LAB_0022c511;
    }
    format = "User bound scaling yields infinite bound\n";
LAB_0022c897:
    highsLogUser(pHVar1,kError,format);
    goto LAB_0022cae8;
  }
LAB_0022c511:
  HVar3 = (local_380->model_).lp_.user_cost_scale_;
  if (HVar3 != 0) {
    bVar9 = costScaleOk(&local_280,HVar3,
                        (local_380->options_).super_HighsOptionsStruct.infinite_cost);
    if (!bVar9) {
      format = "User cost scaling yields infinite cost\n";
      goto LAB_0022c897;
    }
    dVar14 = ldexp(1.0,(local_380->model_).lp_.user_cost_scale_);
    if (0 < (int)local_370) {
      uVar12 = 0;
      do {
        local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12] =
             local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12] * dVar14;
        uVar12 = uVar12 + 1;
      } while (local_340 != uVar12);
    }
  }
  local_378 = (HighsOptions *)&local_380->model_;
  appendColsToLpVectors((HighsLp *)local_378,(HighsInt)local_370,&local_280,&local_298,&local_2b0);
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)local_320);
  pHVar7 = local_380;
  ext_num_new_col_00 = (int)local_370;
  local_320._8_4_ = *local_338;
  local_320._4_4_ = ext_num_new_col_00;
  local_320._0_4_ = 1;
  if (ext_num_new_nz == 0) {
    local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (local_310,(ulong)(ext_num_new_col_00 + 1),(value_type_conflict2 *)&local_368);
LAB_0022c8c9:
    HighsSparseMatrix::HighsSparseMatrix(&local_a0,(HighsSparseMatrix *)local_320);
    HighsSparseMatrix::addCols(&(pHVar7->model_).lp_.a_matrix_,&local_a0,(int8_t *)0x0);
    HighsSparseMatrix::~HighsSparseMatrix(&local_a0);
    if ((pHVar7->model_).lp_.scale_.has_scaling == true) {
      __new_size = local_260 + ext_num_new_col_00;
      this_00 = &(pHVar7->model_).lp_.scale_.col;
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      auVar6 = _DAT_003beea0;
      if (0 < ext_num_new_col_00) {
        iVar4 = *(int *)&(local_378->super_HighsOptionsStruct)._vptr_HighsOptionsStruct;
        pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = local_340 - 1;
        auVar15._8_4_ = (int)lVar13;
        auVar15._0_8_ = lVar13;
        auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
        lVar13 = 0;
        auVar15 = auVar15 ^ _DAT_003beea0;
        auVar16 = _DAT_003bee90;
        do {
          auVar18 = auVar16 ^ auVar6;
          if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                      auVar15._4_4_ < auVar18._4_4_) & 1)) {
            *(undefined8 *)((long)pdVar5 + lVar13 + (long)iVar4 * 8) = 0x3ff0000000000000;
          }
          if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
              auVar18._12_4_ <= auVar15._12_4_) {
            *(undefined8 *)((long)pdVar5 + lVar13 + (long)iVar4 * 8 + 8) = 0x3ff0000000000000;
          }
          lVar17 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 2;
          auVar16._8_8_ = lVar17 + 2;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)((int)local_340 + 1U >> 1) << 4 != lVar13);
      }
      (pHVar7->model_).lp_.scale_.num_col = (HighsInt)__new_size;
      HighsSparseMatrix::applyRowScale((HighsSparseMatrix *)local_320,&(pHVar7->model_).lp_.scale_);
      HighsSparseMatrix::considerColScaling
                ((HighsSparseMatrix *)local_320,
                 (pHVar7->options_).super_HighsOptionsStruct.allowed_matrix_scale_factor,
                 (pHVar7->model_).lp_.scale_.col.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start + (pHVar7->model_).lp_.num_col_);
    }
    if ((pHVar7->basis_).useful == true) {
      appendNonbasicColsToBasisInterface(pHVar7,ext_num_new_col_00);
    }
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
    HighsLp::addColNames((HighsLp *)local_378,&local_1e8,ext_num_new_col_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    (pHVar7->model_).lp_.num_col_ = (pHVar7->model_).lp_.num_col_ + ext_num_new_col_00;
    bVar9 = true;
    if ((pHVar7->model_).lp_.has_infinite_cost_ == false) {
      bVar9 = local_381;
    }
    (pHVar7->model_).lp_.has_infinite_cost_ = bVar9;
    invalidateModelStatusSolutionAndInfo(pHVar7);
    HEkk::addCols(&pHVar7->ekk_instance_,(HighsLp *)local_378,(HighsSparseMatrix *)local_320);
    if ((pHVar7->model_).hessian_.dim_ != 0) {
      completeHessian(*(HighsInt *)&(local_378->super_HighsOptionsStruct)._vptr_HighsOptionsStruct,
                      &(pHVar7->model_).hessian_);
    }
  }
  else {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_368,ext_a_start,ext_a_start + local_340,
               &local_382);
    piVar8 = local_310[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_310[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_368._M_dataplus._M_p;
    local_310[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_368._M_string_length;
    local_310[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_368.field_2._M_allocated_capacity;
    local_368._M_dataplus._M_p = (pointer)0x0;
    local_368._M_string_length = 0;
    local_368.field_2._M_allocated_capacity = 0;
    ext_num_new_col_00 = (int)local_370;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)piVar8 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) && (operator_delete(piVar8), (pointer)local_368._M_dataplus._M_p != (pointer)0x0))
    {
      operator_delete(local_368._M_dataplus._M_p);
    }
    std::vector<int,_std::allocator<int>_>::resize(local_310,(ulong)(ext_num_new_col_00 + 1));
    *(HighsInt *)
     ((long)local_310[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + local_340 * 4) = ext_num_new_nz;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_368,ext_a_index,
               ext_a_index + (uint)ext_num_new_nz,&local_382);
    piVar8 = local_2e0;
    local_2e0 = (pointer)local_368._M_dataplus._M_p;
    piStack_2d8 = (pointer)local_368._M_string_length;
    local_2d0 = (pointer)local_368.field_2._M_allocated_capacity;
    local_368._M_dataplus._M_p = (pointer)0x0;
    local_368._M_string_length = 0;
    local_368.field_2._M_allocated_capacity = 0;
    if ((piVar8 != (pointer)0x0) &&
       (operator_delete(piVar8), (pointer)local_368._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_368,ext_a_value,
               ext_a_value + (uint)ext_num_new_nz,(allocator_type *)&local_382);
    pdVar5 = local_2c8;
    local_2c8 = (pointer)local_368._M_dataplus._M_p;
    pdStack_2c0 = (pointer)local_368._M_string_length;
    local_2b8 = (pointer)local_368.field_2._M_allocated_capacity;
    local_368._M_dataplus._M_p = (pointer)0x0;
    local_368._M_string_length = 0;
    local_368.field_2._M_allocated_capacity = 0;
    if ((pdVar5 != (pointer)0x0) &&
       (operator_delete(pdVar5), local_368._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    local_1c8.log_stream = pHVar1->log_stream;
    local_1c8.output_flag = pHVar1->output_flag;
    local_1c8.log_to_console = pHVar1->log_to_console;
    local_1c8.log_dev_level = pHVar1->log_dev_level;
    local_1c8.user_log_callback = pHVar1->user_log_callback;
    local_1c8.user_log_callback_data = pHVar1->user_log_callback_data;
    pfVar2 = &local_1c8.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar2,local_330);
    local_1c8.user_callback_active = *(bool *)(local_268 + 1);
    local_1c8.user_callback_data = *local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"LP","");
    HVar11 = HighsSparseMatrix::assess
                       ((HighsSparseMatrix *)local_320,pHVar1,&local_258,
                        (pHVar7->options_).super_HighsOptionsStruct.small_matrix_value,
                        (pHVar7->options_).super_HighsOptionsStruct.large_matrix_value);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"assessMatrix","");
    HVar10 = interpretCallStatus(&local_1c8,HVar11,HVar10,&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if (local_1c8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1c8.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
    }
    if (HVar10 != kError) goto LAB_0022c8c9;
    HVar10 = kError;
  }
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)local_320);
  HVar11 = HVar10;
LAB_0022cae8:
  if (local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_238.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_238.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar11;
}

Assistant:

HighsStatus Highs::addColsInterface(
    HighsInt ext_num_new_col, const double* ext_col_cost,
    const double* ext_col_lower, const double* ext_col_upper,
    HighsInt ext_num_new_nz, const HighsInt* ext_a_start,
    const HighsInt* ext_a_index, const double* ext_a_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsOptions& options = options_;
  if (ext_num_new_col < 0) return HighsStatus::kError;
  if (ext_num_new_nz < 0) return HighsStatus::kError;
  if (ext_num_new_col == 0) return HighsStatus::kOk;
  if (ext_num_new_col > 0)
    if (isColDataNull(options.log_options, ext_col_cost, ext_col_lower,
                      ext_col_upper))
      return HighsStatus::kError;
  if (ext_num_new_nz > 0)
    if (isMatrixDataNull(options.log_options, ext_a_start, ext_a_index,
                         ext_a_value))
      return HighsStatus::kError;

  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsScale& scale = lp.scale_;
  bool& useful_basis = basis.useful;
  bool& lp_has_scaling = lp.scale_.has_scaling;

  // Check that if nonzeros are to be added then the model has a positive number
  // of rows
  if (lp.num_row_ <= 0 && ext_num_new_nz > 0) return HighsStatus::kError;

  // Record the new number of columns
  HighsInt newNumCol = lp.num_col_ + ext_num_new_col;

  HighsIndexCollection index_collection;
  index_collection.dimension_ = ext_num_new_col;
  index_collection.is_interval_ = true;
  index_collection.from_ = 0;
  index_collection.to_ = ext_num_new_col - 1;

  // Take a copy of the cost and bounds that can be normalised
  std::vector<double> local_colCost{ext_col_cost,
                                    ext_col_cost + ext_num_new_col};
  std::vector<double> local_colLower{ext_col_lower,
                                     ext_col_lower + ext_num_new_col};
  std::vector<double> local_colUpper{ext_col_upper,
                                     ext_col_upper + ext_num_new_col};

  bool local_has_infinite_cost = false;
  return_status = interpretCallStatus(
      options_.log_options,
      assessCosts(options, lp.num_col_, index_collection, local_colCost,
                  local_has_infinite_cost, options.infinite_cost),
      return_status, "assessCosts");
  if (return_status == HighsStatus::kError) return return_status;
  // Assess the column bounds
  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options, "Col", lp.num_col_, index_collection,
                   local_colLower, local_colUpper, options.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_colLower, local_colUpper, lp.user_bound_scale_,
                      options.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++) {
      local_colLower[iCol] *= bound_scale_value;
      local_colUpper[iCol] *= bound_scale_value;
    }
  }
  if (lp.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!costScaleOk(local_colCost, lp.user_cost_scale_,
                     options.infinite_cost)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User cost scaling yields infinite cost\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, lp.user_cost_scale_);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++)
      local_colCost[iCol] *= cost_scale_value;
  }
  // Append the columns to the LP vectors and matrix
  appendColsToLpVectors(lp, ext_num_new_col, local_colCost, local_colLower,
                        local_colUpper);
  // Form a column-wise HighsSparseMatrix of the new matrix columns so
  // that is easy to handle and, if there are nonzeros, it can be
  // normalised
  HighsSparseMatrix local_a_matrix;
  local_a_matrix.num_col_ = ext_num_new_col;
  local_a_matrix.num_row_ = lp.num_row_;
  local_a_matrix.format_ = MatrixFormat::kColwise;
  if (ext_num_new_nz) {
    local_a_matrix.start_ = {ext_a_start, ext_a_start + ext_num_new_col};
    local_a_matrix.start_.resize(ext_num_new_col + 1);
    local_a_matrix.start_[ext_num_new_col] = ext_num_new_nz;
    local_a_matrix.index_ = {ext_a_index, ext_a_index + ext_num_new_nz};
    local_a_matrix.value_ = {ext_a_value, ext_a_value + ext_num_new_nz};
    // Assess the matrix rows
    return_status =
        interpretCallStatus(options_.log_options,
                            local_a_matrix.assess(options.log_options, "LP",
                                                  options.small_matrix_value,
                                                  options.large_matrix_value),
                            return_status, "assessMatrix");
    if (return_status == HighsStatus::kError) return return_status;
  } else {
    // No nonzeros so, whether the constraint matrix is column-wise or
    // row-wise, adding the empty matrix is trivial. Complete the
    // setup of an empty column-wise HighsSparseMatrix of the new
    // matrix columns
    local_a_matrix.start_.assign(ext_num_new_col + 1, 0);
  }
  // Append the columns to LP matrix
  lp.a_matrix_.addCols(local_a_matrix);
  if (lp_has_scaling) {
    // Extend the column scaling factors
    scale.col.resize(newNumCol);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++)
      scale.col[lp.num_col_ + iCol] = 1.0;
    scale.num_col = newNumCol;
    // Apply the existing row scaling to the new columns
    local_a_matrix.applyRowScale(scale);
    // Consider applying column scaling to the new columns.
    local_a_matrix.considerColScaling(options.allowed_matrix_scale_factor,
                                      &scale.col[lp.num_col_]);
  }
  // Update the basis corresponding to new nonbasic columns
  if (useful_basis) appendNonbasicColsToBasisInterface(ext_num_new_col);

  // Possibly add column names
  lp.addColNames("", ext_num_new_col);

  // Increase the number of columns in the LP
  lp.num_col_ += ext_num_new_col;
  assert(lpDimensionsOk("addCols", lp, options.log_options));

  // Interpret possible introduction of infinite costs
  lp.has_infinite_cost_ = lp.has_infinite_cost_ || local_has_infinite_cost;
  assert(lp.has_infinite_cost_ == lp.hasInfiniteCost(options.infinite_cost));

  // Deduce the consequences of adding new columns
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.addCols(lp, local_a_matrix);

  // Extend any Hessian with zeros on the diagonal
  if (this->model_.hessian_.dim_)
    completeHessian(lp.num_col_, this->model_.hessian_);
  return return_status;
}